

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventRegistry.cpp
# Opt level: O0

ostream * license::operator<<(ostream *out,EventRegistry *er)

{
  EventRegistry *this;
  bool bVar1;
  ostream *poVar2;
  reference paVar3;
  anon_struct_1288_4_4db92441 *it;
  const_iterator __end1;
  const_iterator __begin1;
  vector<AuditEvent,_std::allocator<AuditEvent>_> *__range1;
  allocator local_39;
  string local_38 [32];
  EventRegistry *local_18;
  EventRegistry *er_local;
  ostream *out_local;
  
  local_18 = er;
  er_local = (EventRegistry *)out;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"EventReg[step:",&local_39);
  poVar2 = std::operator<<(out,local_38);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_18->current_validation_step);
  std::operator<<(poVar2,",events:{");
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  this = local_18;
  __end1 = std::vector<AuditEvent,_std::allocator<AuditEvent>_>::begin(&local_18->logs);
  it = (anon_struct_1288_4_4db92441 *)
       std::vector<AuditEvent,_std::allocator<AuditEvent>_>::end(&this->logs);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_AuditEvent_*,_std::vector<AuditEvent,_std::allocator<AuditEvent>_>_>
                                *)&it);
    if (!bVar1) break;
    paVar3 = __gnu_cxx::
             __normal_iterator<const_AuditEvent_*,_std::vector<AuditEvent,_std::allocator<AuditEvent>_>_>
             ::operator*(&__end1);
    poVar2 = std::operator<<((ostream *)er_local,"[ev:");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,paVar3->event_type);
    poVar2 = std::operator<<(poVar2,",sev:");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,paVar3->severity);
    poVar2 = std::operator<<(poVar2,"ref:");
    poVar2 = std::operator<<(poVar2,paVar3->license_reference);
    std::operator<<(poVar2,"]");
    __gnu_cxx::
    __normal_iterator<const_AuditEvent_*,_std::vector<AuditEvent,_std::allocator<AuditEvent>_>_>::
    operator++(&__end1);
  }
  std::operator<<((ostream *)er_local,"]");
  return (ostream *)er_local;
}

Assistant:

ostream &operator<<(std::ostream &out, const EventRegistry &er) {
	out << string("EventReg[step:") << er.current_validation_step << ",events:{";
	for (auto &it : er.logs) {
		out << "[ev:" << it.event_type << ",sev:" << it.severity << "ref:" << it.license_reference << "]";
	}
	out << "]";
	return out;
}